

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-lore.c
# Opt level: O0

void lore_append_toughness
               (textblock *tb,monster_race *race,monster_lore_conflict *lore,bitflag *known_flags)

{
  _Bool _Var1;
  monster_sex_t sex;
  wchar_t to_hit;
  uint uVar2;
  char *pcVar3;
  random_chance rStack_40;
  wchar_t percent;
  random_chance c;
  object *weapon;
  monster_sex_t msex;
  bitflag *known_flags_local;
  monster_lore_conflict *lore_local;
  monster_race *race_local;
  textblock *tb_local;
  
  c = (random_chance)equipped_item_by_slot_name(player,"weapon");
  if (((tb != (textblock *)0x0) && (race != (monster_race *)0x0)) &&
     (lore != (monster_lore_conflict *)0x0)) {
    sex = lore_monster_sex(race);
    if ((lore->armour_known & 1U) != 0) {
      pcVar3 = lore_pronoun_nominative(sex,true);
      textblock_append(tb,"%s has a",pcVar3);
      _Var1 = flag_has_dbg(known_flags,0xc,1,"known_flags","RF_UNIQUE");
      if (!_Var1) {
        textblock_append(tb,"n average");
      }
      textblock_append(tb," life rating of ");
      textblock_append_c(tb,'\x0e',"%d",(ulong)(uint)race->avg_hp);
      textblock_append(tb,", and an armor rating of ");
      textblock_append_c(tb,'\x0e',"%d",(ulong)(uint)race->ac);
      textblock_append(tb,".  ");
      to_hit = chance_of_melee_hit_base(player,(object *)c);
      hit_chance(&stack0xffffffffffffffc0,to_hit,race->ac);
      uVar2 = random_chance_scaled(rStack_40,100);
      textblock_append(tb,"You have a");
      if ((uVar2 == 8) || ((int)uVar2 / 10 == 8)) {
        textblock_append(tb,"n");
      }
      textblock_append_c(tb,'\x0e'," %d",(ulong)uVar2);
      textblock_append(tb,"%% chance to hit such a creature in melee (if you can see it).  ");
    }
    return;
  }
  __assert_fail("tb && race && lore",
                "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/mon-lore.c"
                ,0x429,
                "void lore_append_toughness(textblock *, const struct monster_race *, const struct monster_lore *, bitflag *)"
               );
}

Assistant:

void lore_append_toughness(textblock *tb, const struct monster_race *race,
						   const struct monster_lore *lore,
						   bitflag known_flags[RF_SIZE])
{
	monster_sex_t msex = MON_SEX_NEUTER;
	struct object *weapon = equipped_item_by_slot_name(player, "weapon");

	assert(tb && race && lore);

	/* Extract a gender (if applicable) */
	msex = lore_monster_sex(race);

	/* Describe monster "toughness" */
	if (lore->armour_known) {
		/* Hitpoints */
		textblock_append(tb, "%s has a", lore_pronoun_nominative(msex, true));

		if (!rf_has(known_flags, RF_UNIQUE))
			textblock_append(tb, "n average");

		textblock_append(tb, " life rating of ");
		textblock_append_c(tb, COLOUR_L_BLUE, "%d", race->avg_hp);

		/* Armor */
		textblock_append(tb, ", and an armor rating of ");
		textblock_append_c(tb, COLOUR_L_BLUE, "%d", race->ac);
		textblock_append(tb, ".  ");

		/* Player's base chance to hit */
		random_chance c;
		hit_chance(&c, chance_of_melee_hit_base(player, weapon), race->ac);
		int percent = random_chance_scaled(c, 100);

		textblock_append(tb, "You have a");
		if (percent == 8 || percent / 10 == 8)
			textblock_append(tb, "n");
		textblock_append_c(tb, COLOUR_L_BLUE, " %d", percent);
		textblock_append(tb, "%% chance to hit such a creature in melee (if you can see it).  ");
	}
}